

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_matrix.c
# Opt level: O0

int gdAffineInvert(double *dst,double *src)

{
  double dVar1;
  double dVar2;
  double r_det;
  double *src_local;
  double *dst_local;
  
  dVar1 = *src * src[3] + -(src[1] * src[2]);
  if (0.0 < dVar1) {
    dVar2 = 1.0 / dVar1;
    *dst = src[3] * dVar2;
    dst[1] = -src[1] * dVar2;
    dst[2] = -src[2] * dVar2;
    dst[3] = *src * dVar2;
    dst[4] = -src[4] * *dst + -(src[5] * dst[2]);
    dst[5] = -src[4] * dst[1] + -(src[5] * dst[3]);
  }
  dst_local._4_4_ = (uint)(0.0 < dVar1);
  return dst_local._4_4_;
}

Assistant:

BGD_DECLARE(int) gdAffineInvert (double dst[6], const double src[6])
{
	double r_det = (src[0] * src[3] - src[1] * src[2]);

	if (r_det <= 0.0) {
		return GD_FALSE;
	}

	r_det = 1.0 / r_det;
	dst[0] = src[3] * r_det;
	dst[1] = -src[1] * r_det;
	dst[2] = -src[2] * r_det;
	dst[3] = src[0] * r_det;
	dst[4] = -src[4] * dst[0] - src[5] * dst[2];
	dst[5] = -src[4] * dst[1] - src[5] * dst[3];
	return GD_TRUE;
}